

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageProcessing2QCOMWindowDecoration
          (ValidationState_t *_,int id)

{
  uint16_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  Instruction *this;
  Instruction *this_00;
  spv_result_t sVar4;
  string sStack_218;
  DiagnosticStream local_1f8;
  
  this = ValidationState_t::FindDef(_,id);
  uVar1 = (this->inst_).opcode;
  if (uVar1 == 0x3d) {
    uVar3 = Instruction::GetOperandAs<int>(this,2);
    bVar2 = ValidationState_t::HasDecoration(_,uVar3,BlockMatchTextureQCOM);
    if (bVar2) {
LAB_001ca7f0:
      bVar2 = ValidationState_t::HasDecoration(_,uVar3,BlockMatchSamplerQCOM);
      if (bVar2) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,this);
      std::operator<<((ostream *)&local_1f8,"Missing decoration ");
      uVar3 = 0x1193;
    }
    else {
LAB_001ca83a:
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,this);
      std::operator<<((ostream *)&local_1f8,"Missing decoration ");
      uVar3 = 0x1188;
    }
    ValidationState_t::SpvDecorationString_abi_cxx11_(&sStack_218,_,uVar3);
    std::operator<<((ostream *)&local_1f8,(string *)&sStack_218);
    std::__cxx11::string::_M_dispose();
    sVar4 = local_1f8.error_;
  }
  else {
    if (uVar1 != 0x56) {
      ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,this);
      std::operator<<((ostream *)&local_1f8,"Expect to see OpLoad");
      sVar4 = local_1f8.error_;
      goto LAB_001ca8f5;
    }
    uVar3 = Instruction::GetOperandAs<int>(this,2);
    this_00 = ValidationState_t::FindDef(_,uVar3);
    if ((this_00->inst_).opcode == 0x3d) {
      uVar3 = Instruction::GetOperandAs<int>(this_00,2);
      bVar2 = ValidationState_t::HasDecoration(_,uVar3,BlockMatchTextureQCOM);
      if (!bVar2) goto LAB_001ca83a;
      uVar3 = Instruction::GetOperandAs<int>(this,3);
      this_00 = ValidationState_t::FindDef(_,uVar3);
      if ((this_00->inst_).opcode == 0x3d) {
        uVar3 = Instruction::GetOperandAs<int>(this_00,2);
        goto LAB_001ca7f0;
      }
    }
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,this_00);
    std::operator<<((ostream *)&local_1f8,"Expect to see OpLoad");
    sVar4 = local_1f8.error_;
  }
LAB_001ca8f5:
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  return sVar4;
}

Assistant:

spv_result_t ValidateImageProcessing2QCOMWindowDecoration(ValidationState_t& _,
                                                          int id) {
  const Instruction* ld_inst = _.FindDef(id);
  bool is_intf_obj = (ld_inst->opcode() != spv::Op::OpSampledImage);
  if (is_intf_obj == true) {
    if (ld_inst->opcode() != spv::Op::OpLoad) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst) << "Expect to see OpLoad";
    }
    int texture_id = ld_inst->GetOperandAs<int>(2);  // variable to load
    spv::Decoration decor = spv::Decoration::BlockMatchTextureQCOM;
    if (!_.HasDecoration(texture_id, decor)) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
             << "Missing decoration " << _.SpvDecorationString(decor);
    }
    decor = spv::Decoration::BlockMatchSamplerQCOM;
    if (!_.HasDecoration(texture_id, decor)) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
             << "Missing decoration " << _.SpvDecorationString(decor);
    }
  } else {
    const Instruction* si_inst = ld_inst;
    int t_idx = si_inst->GetOperandAs<int>(2);  // texture
    const Instruction* t_ld_inst = _.FindDef(t_idx);
    if (t_ld_inst->opcode() != spv::Op::OpLoad) {
      return _.diag(SPV_ERROR_INVALID_DATA, t_ld_inst)
             << "Expect to see OpLoad";
    }
    int texture_id = t_ld_inst->GetOperandAs<int>(2);  // variable to load
    spv::Decoration decor = spv::Decoration::BlockMatchTextureQCOM;
    if (!_.HasDecoration(texture_id, decor)) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
             << "Missing decoration " << _.SpvDecorationString(decor);
    }
    int s_idx = si_inst->GetOperandAs<int>(3);  // sampler
    const Instruction* s_ld_inst = _.FindDef(s_idx);
    if (s_ld_inst->opcode() != spv::Op::OpLoad) {
      return _.diag(SPV_ERROR_INVALID_DATA, s_ld_inst)
             << "Expect to see OpLoad";
    }
    int sampler_id = s_ld_inst->GetOperandAs<int>(2);  // variable to load
    decor = spv::Decoration::BlockMatchSamplerQCOM;
    if (!_.HasDecoration(sampler_id, decor)) {
      return _.diag(SPV_ERROR_INVALID_DATA, ld_inst)
             << "Missing decoration " << _.SpvDecorationString(decor);
    }
  }

  return SPV_SUCCESS;
}